

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5SocketEnginePrivate::sendRequestMethod(QSocks5SocketEnginePrivate *this)

{
  ushort port;
  bool bVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QHostAddress address;
  QArrayDataPointer<char> local_68;
  ushort local_4a;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  address.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&address);
  if (this->mode == ConnectMode) {
    lVar4 = 0xc0;
    lVar2 = 0xb8;
  }
  else {
    lVar4 = 0xb0;
    lVar2 = 0xa8;
  }
  QHostAddress::operator=
            (&address,(QHostAddress *)
                      (&(this->super_QAbstractSocketEnginePrivate).super_QObjectPrivate + lVar2));
  port = *(ushort *)(&(this->super_QAbstractSocketEnginePrivate).super_QObjectPrivate + lVar4);
  local_88.d = (Data *)0x0;
  local_88.ptr = (char *)0x0;
  local_88.size = 0;
  QByteArray::reserve((QByteArray *)&local_88,0x10e);
  cVar3 = (char)&local_88;
  QByteArray::append(cVar3);
  QByteArray::append(cVar3);
  QByteArray::append(cVar3);
  if ((this->peerName).d.size == 0) {
    bVar1 = qt_socks5_set_host_address_and_port(&address,port,(QByteArray *)&local_88);
    if (!bVar1) goto LAB_0021f99d;
    if ((this->peerName).d.size != 0) goto LAB_0021f88e;
LAB_0021f923:
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    QByteArray::operator=((QByteArray *)&local_48,(QByteArray *)&local_88);
    QIODevice::write((QByteArray *)this->data->controlSocket);
    QAbstractSocket::flush(&this->data->controlSocket->super_QAbstractSocket);
    this->socks5State = RequestMethodSent;
  }
  else {
LAB_0021f88e:
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toAce(&local_48,&this->peerName,0);
    if ((ulong)local_48.size < (undefined1 *)0x100) {
      QByteArray::append(cVar3);
      QByteArray::append(cVar3);
      QByteArray::append((QByteArray *)&local_88);
      local_4a = port << 8 | port >> 8;
      QByteArray::fromRawData((QByteArray *)&local_68,(char *)&local_4a,2);
      QByteArray::append((QByteArray *)&local_88);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      goto LAB_0021f923;
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
LAB_0021f99d:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QHostAddress::~QHostAddress(&address);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::sendRequestMethod()
{
    QHostAddress address;
    quint16 port = 0;
    char command = 0;
    if (mode == ConnectMode) {
        command = S5_CONNECT;
        address = peerAddress;
        port = peerPort;
    } else if (mode == BindMode) {
        command = S5_BIND;
        address = localAddress;
        port = localPort;
    } else {
#ifndef QT_NO_UDPSOCKET
        command = S5_UDP_ASSOCIATE;
        address = localAddress; //data->controlSocket->localAddress();
        port = localPort;
#endif
    }

    QByteArray buf;
    buf.reserve(270); // big enough for domain name;
    buf.append(char(S5_VERSION_5));
    buf.append(command);
    buf.append('\0');
    if (peerName.isEmpty() && !qt_socks5_set_host_address_and_port(address, port, &buf)) {
        QSOCKS5_DEBUG << "error setting address" << address << " : " << port;
        //### set error code ....
        return;
    } else if (!peerName.isEmpty() && !qt_socks5_set_host_name_and_port(peerName, port, &buf)) {
        QSOCKS5_DEBUG << "error setting peer name" << peerName << " : " << port;
        //### set error code ....
        return;
    }
    QSOCKS5_DEBUG << "sending" << dump(buf);
    QByteArray sealedBuf;
    if (!data->authenticator->seal(buf, &sealedBuf)) {
        // ### Handle this error.
    }
    data->controlSocket->write(sealedBuf);
    data->controlSocket->flush();
    socks5State = RequestMethodSent;
}